

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsmcpl.c
# Opt level: O1

int phits2mcpl2(char *phitsdumpfile,char *mcplfile,int opt_dp,int opt_gzip,char *inputdeckfile,
               char *dumpsummaryfile)

{
  int iVar1;
  phits_file_t ff;
  undefined8 uVar2;
  char *pcVar3;
  double *pdVar4;
  phits_particle_t *ppVar5;
  char *pcVar6;
  size_t sVar7;
  void *__dest;
  uint64_t cfgfile_lbuf;
  char *cfgfile_buf;
  undefined4 local_48 [2];
  char *local_40;
  int local_34;
  
  local_34 = opt_gzip;
  ff = phits_open_file(phitsdumpfile);
  uVar2 = mcpl_create_outfile(mcplfile);
  mcpl_hdr_set_srcname(uVar2,"PHITS");
  mcpl_hdr_add_comment(uVar2,"Converted from PHITS with phits2mcpl");
  if (opt_dp != 0) {
    mcpl_enable_doubleprec(uVar2);
  }
  iVar1 = phits_has_polarisation(ff);
  if (iVar1 != 0) {
    mcpl_enable_polarisation(uVar2);
  }
  if (inputdeckfile != (char *)0x0) {
    mcpl_read_file_to_buffer(inputdeckfile,0x6400000,1,local_48,&local_40);
    pcVar6 = local_40;
    pcVar3 = strstr(local_40,"dump");
    if (pcVar3 == (char *)0x0) {
      printf("Error: specified configuration file %s looks invalid as it does not contain the word \"dump\".\n"
             ,inputdeckfile);
      return 0;
    }
    mcpl_hdr_add_data(uVar2,"phits_input_deck",local_48[0],pcVar6);
    free(local_40);
  }
  if (dumpsummaryfile != (char *)0x0) {
    mcpl_read_file_to_buffer(dumpsummaryfile,0x6400000,1,local_48,&local_40);
    pcVar6 = local_40;
    pcVar3 = strstr(local_40,"dump");
    if (pcVar3 == (char *)0x0) {
      printf("Error: specified dump summary file %s looks invalid as it does not contain the word \"dump\".\n"
             ,dumpsummaryfile);
      return 0;
    }
    mcpl_hdr_add_data(uVar2,"phits_dump_summary_file",local_48[0],pcVar6);
    free(local_40);
  }
  pdVar4 = (double *)mcpl_get_empty_particle(uVar2);
  do {
    ppVar5 = phits_load_particle(ff);
    if (ppVar5 == (phits_particle_t *)0x0) break;
    if (ppVar5->pdgcode == 0) {
      printf("Warning: ignored particle with no PDG code set (raw phits kt code was %li).\n",
             ppVar5->rawtype);
    }
    else {
      *(int *)(pdVar4 + 0xc) = (int)ppVar5->pdgcode;
      pdVar4[4] = ppVar5->x;
      pdVar4[5] = ppVar5->y;
      pdVar4[6] = ppVar5->z;
      pdVar4[7] = ppVar5->dirx;
      pdVar4[8] = ppVar5->diry;
      pdVar4[9] = ppVar5->dirz;
      pdVar4[1] = ppVar5->polx;
      pdVar4[2] = ppVar5->poly;
      pdVar4[3] = ppVar5->polz;
      pdVar4[10] = ppVar5->time * 1e-06;
      pdVar4[0xb] = ppVar5->weight;
      *pdVar4 = ppVar5->ekin;
      mcpl_add_particle(uVar2,pdVar4);
    }
  } while (ppVar5 != (phits_particle_t *)0x0);
  pcVar6 = (char *)mcpl_outfile_filename(uVar2);
  sVar7 = strlen(pcVar6);
  __dest = malloc(sVar7 + 1);
  if (__dest == (void *)0x0) {
    puts("Error: Memory allocation error");
    return 0;
  }
  memcpy(__dest,pcVar6,sVar7 + 1);
  if (local_34 == 0) {
    mcpl_close_outfile(uVar2);
    pcVar6 = "";
  }
  else {
    iVar1 = mcpl_closeandgzip_outfile(uVar2);
    pcVar6 = ".gz";
    if (iVar1 == 0) {
      pcVar6 = "";
    }
  }
  phits_close_file(ff);
  printf("Created %s%s\n",__dest,pcVar6);
  free(__dest);
  return 1;
}

Assistant:

int phits2mcpl2( const char * phitsdumpfile, const char * mcplfile,
                 int opt_dp, int opt_gzip,
                 const char * inputdeckfile,
                 const char * dumpsummaryfile )
{
  phits_file_t f = phits_open_file(phitsdumpfile);
  mcpl_outfile_t mcplfh = mcpl_create_outfile(mcplfile);

  mcpl_hdr_set_srcname(mcplfh,"PHITS");
  mcpl_hdr_add_comment(mcplfh,"Converted from PHITS with phits2mcpl");

  if (opt_dp)
    mcpl_enable_doubleprec(mcplfh);

  if (phits_has_polarisation(f))
    mcpl_enable_polarisation(mcplfh);

  if (inputdeckfile) {
    char* cfgfile_buf;
    uint64_t cfgfile_lbuf;
    mcpl_read_file_to_buffer( inputdeckfile,
                              104857600,//100mb max
                              1,//text
                              &cfgfile_lbuf,
                              &cfgfile_buf );

    //We won't do much for sanity checks since we want to avoid the risk of
    //false positives, but at least the word "dump" should occur in both input
    //deck and dump summary files:
    if (!strstr((const char*)cfgfile_buf, "dump")) {
      printf("Error: specified configuration file %s looks invalid as it"
             " does not contain the word \"dump\".\n",inputdeckfile);
      return 0;
    }
    mcpl_hdr_add_data( mcplfh,
                       "phits_input_deck",
                       (uint32_t)cfgfile_lbuf,
                       (const char *)cfgfile_buf );
    free(cfgfile_buf);
  }
  if (dumpsummaryfile) {
    char* summaryfile_buf;
    uint64_t summaryfile_lbuf;
    mcpl_read_file_to_buffer( dumpsummaryfile,
                              104857600,//100mb max
                              1,//text
                              &summaryfile_lbuf,
                              &summaryfile_buf );

    //Same check as for the input deck above:
    if (!strstr(summaryfile_buf, "dump")) {
      printf("Error: specified dump summary file %s looks invalid"
             " as it does not contain the word \"dump\".\n",dumpsummaryfile);
      return 0;
    }
    mcpl_hdr_add_data( mcplfh,
                       "phits_dump_summary_file",
                       (uint32_t)summaryfile_lbuf,
                       summaryfile_buf );
    free(summaryfile_buf);
  }

  mcpl_particle_t* mcpl_particle = mcpl_get_empty_particle(mcplfh);

  while ( 1 ) {
    const phits_particle_t * p = phits_load_particle(f);
    if (!p)
      break;

    if (!p->pdgcode) {
      printf("Warning: ignored particle with no PDG code set (raw phits kt"
             " code was %li).\n",p->rawtype);
      continue;
    }
    mcpl_particle->pdgcode = p->pdgcode;
    mcpl_particle->position[0] = p->x;//already in cm
    mcpl_particle->position[1] = p->y;//already in cm
    mcpl_particle->position[2] = p->z;//already in cm
    mcpl_particle->direction[0] = p->dirx;
    mcpl_particle->direction[1] = p->diry;
    mcpl_particle->direction[2] = p->dirz;
    mcpl_particle->polarisation[0] = p->polx;
    mcpl_particle->polarisation[1] = p->poly;
    mcpl_particle->polarisation[2] = p->polz;
    mcpl_particle->time = p->time * 1.0e-6;//nanoseconds (PHITS) to milliseconds
                                           //(MCPL)
    mcpl_particle->weight = p->weight;
    mcpl_particle->ekin = p->ekin;//already in MeV
    mcpl_add_particle(mcplfh,mcpl_particle);
  }

  const char * tmp = mcpl_outfile_filename(mcplfh);
  size_t laf = strlen(tmp);
  char * actual_filename = malloc(laf+1);
  if (!actual_filename) {
    printf("Error: Memory allocation error\n");
    return 0;
  }
  memcpy(actual_filename,tmp,laf+1);

  int did_gzip = 0;
  if (opt_gzip)
    did_gzip = mcpl_closeandgzip_outfile(mcplfh);
  else
    mcpl_close_outfile(mcplfh);
  phits_close_file(f);

  printf("Created %s%s\n",actual_filename,(did_gzip?".gz":""));
  free(actual_filename);
  return 1;
}